

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

bool __thiscall
cappuccino::
tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::insert(tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
         *this,milliseconds ttl,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  bool bVar1;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> local_48;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time;
  time_point now;
  allow a_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  milliseconds ttl_local;
  
  this_local = (tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)ttl.__r;
  expire_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  guard._M_device =
       (mutex_type *)
       std::chrono::operator+(&expire_time,(duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            (&local_48,&this->m_lock);
  bVar1 = do_insert_update(this,key,value,(time_point)expire_time.__d.__r,
                           (time_point)guard._M_device,a);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            (&local_48);
  return bVar1;
}

Assistant:

auto insert(std::chrono::milliseconds ttl, const key_type& key, value_type value, allow a = allow::insert_or_update)
        -> bool
    {
        auto now         = std::chrono::steady_clock::now();
        auto expire_time = now + ttl;

        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), now, expire_time, a);
    }